

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O1

MMDB_s * open_ok(char *db_file,int mode,char *mode_desc)

{
  int iVar1;
  uint error_code;
  MMDB_s *mmdb;
  char *pcVar2;
  
  iVar1 = access(db_file,4);
  if (iVar1 != 0) {
    bail_out(0,
             "could not read the specified file - %s\nIf you are in a git checkout try running \'git submodule update --init\'"
             ,db_file,0);
  }
  mmdb = (MMDB_s *)calloc(1,0x88);
  if (mmdb == (MMDB_s *)0x0) {
    bail_out(0,"could not allocate memory for our MMDB_s struct",0);
  }
  error_code = MMDB_open(db_file,mode,mmdb);
  iVar1 = ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                    ,0x69,(uint)(error_code == 0),"open %s status is success - %s",db_file,mode_desc
                    ,0);
  if (iVar1 == 0) {
    pcVar2 = MMDB_strerror(error_code);
    diag("open status code = %d (%s)",(ulong)error_code,pcVar2);
  }
  else {
    iVar1 = ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                      ,0x74,(uint)(0 < mmdb->file_size),"mmdb struct has been set for %s - %s",
                      db_file,mode_desc,0);
    if (iVar1 != 0) {
      return mmdb;
    }
  }
  free(mmdb);
  return (MMDB_s *)0x0;
}

Assistant:

MMDB_s *open_ok(const char *db_file, int mode, const char *mode_desc) {
#ifdef _WIN32
    int access_rv = _access(db_file, 04);
#else
    int access_rv = access(db_file, R_OK);
#endif
    if (access_rv != 0) {
        BAIL_OUT("could not read the specified file - %s\nIf you are in a git "
                 "checkout try running 'git submodule update --init'",
                 db_file);
    }

    MMDB_s *mmdb = (MMDB_s *)calloc(1, sizeof(MMDB_s));

    if (NULL == mmdb) {
        BAIL_OUT("could not allocate memory for our MMDB_s struct");
    }

    int status = MMDB_open(db_file, (uint32_t)mode, mmdb);

    int is_ok = ok(MMDB_SUCCESS == status,
                   "open %s status is success - %s",
                   db_file,
                   mode_desc);

    if (!is_ok) {
        diag("open status code = %d (%s)", status, MMDB_strerror(status));
        free(mmdb);
        return NULL;
    }

    is_ok = ok(mmdb->file_size > 0,
               "mmdb struct has been set for %s - %s",
               db_file,
               mode_desc);

    if (!is_ok) {
        free(mmdb);
        return NULL;
    }

    return mmdb;
}